

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

int __thiscall kj::WaitScope::poll(WaitScope *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint uVar1;
  bool bVar2;
  long *in_FS_OFFSET;
  Type local_a8;
  uint local_8c;
  Type TStack_88;
  uint turnCount;
  undefined1 local_80 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1926:3)>
  _kjDefer1926;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_58;
  Fault f;
  EventLoop *local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> _kjCondition;
  uint maxTurnCount_local;
  WaitScope *this_local;
  
  _kjCondition._36_4_ = SUB84(__fds,0);
  f.exception = (Exception *)this->loop;
  local_48 = (EventLoop *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(EventLoop **)&f);
  kj::_::DebugExpression<kj::EventLoop*>::operator==
            ((DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_40,
             (DebugExpression<kj::EventLoop*> *)&local_48,(EventLoop **)(*in_FS_OFFSET + -0x20));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x782,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",
               (DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_40,
               (char (*) [37])"WaitScope not valid for this thread.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  f_1.exception._2_1_ = (this->loop->running ^ 0xffU) & 1;
  f_1.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
              ((Fault *)&_kjDefer1926.maybeFunc.ptr.field_1.value,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x783,FAILED,"!loop.running",
               "_kjCondition,\"poll() is not allowed from within event callbacks.\"",
               (DebugExpression<bool> *)((long)&f_1.exception + 3),
               (char (*) [51])"poll() is not allowed from within event callbacks.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer1926.maybeFunc.ptr.field_1.value);
  }
  this->loop->running = true;
  TStack_88.this = this;
  defer<kj::WaitScope::poll(unsigned_int)::__0>((kj *)local_80,&stack0xffffffffffffff78);
  local_8c = 0;
  local_a8.turnCount = &local_8c;
  local_a8.maxTurnCount = (uint *)&_kjCondition.field_0x24;
  local_a8.this = this;
  runOnStackPool<kj::WaitScope::poll(unsigned_int)::__1>(this,&local_a8);
  uVar1 = local_8c;
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1926:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1926:3)>
               *)local_80);
  return uVar1;
}

Assistant:

uint WaitScope::poll(uint maxTurnCount) {
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  loop.running = true;
  KJ_DEFER(loop.running = false);

  uint turnCount = 0;
  runOnStackPool([&]() {
    while (turnCount < maxTurnCount) {
      if (loop.turn()) {
        ++turnCount;
      } else {
        // No events in the queue.  Poll for I/O.
        loop.poll();

        if (!loop.isRunnable()) {
          // Still no events in the queue. We're done.
          return;
        }
      }
    }
  });
  return turnCount;
}